

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O2

ssize_t __thiscall
boost::deflate::inflate_stream_test::ZlibDecompressor::write
          (ZlibDecompressor *this,int __fd,void *__buf,size_t __n)

{
  char *__s1;
  error e;
  int iVar1;
  undefined8 *puVar2;
  runtime_error *this_00;
  error_code local_20;
  
  iVar1 = inflate(&this->zs,write::zlib_flushes[__fd]);
  switch(iVar1) {
  case 0:
    local_20.val_ = 0;
    local_20._4_4_ = local_20._4_4_ & 0xffffff00;
    goto LAB_001096d9;
  case 1:
    e = end_of_stream;
    break;
  case 2:
    e = need_dict;
    break;
  case -5:
    e = need_buffers;
    break;
  case -4:
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = std::operator<<;
    __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  case -3:
    __s1 = (this->zs).msg;
    if (__s1 == (char *)0x0) goto switchD_00109516_caseD_fffffffe;
    iVar1 = strcmp(__s1,"invalid stored block lengths");
    if (iVar1 == 0) {
      e = invalid_stored_length;
    }
    else {
      iVar1 = strcmp(__s1,"invalid block type");
      if (iVar1 == 0) {
        e = invalid_block_type;
      }
      else {
        iVar1 = strcmp(__s1,"too many length or distance symbols");
        if (iVar1 == 0) {
          e = too_many_symbols;
        }
        else {
          iVar1 = strcmp(__s1,"invalid code lengths set");
          if (iVar1 == 0) {
            e = incomplete_length_set;
          }
          else {
            iVar1 = strcmp(__s1,"invalid literal/lengths set");
            if (iVar1 == 0) {
              e = over_subscribed_length;
            }
            else {
              iVar1 = strcmp(__s1,"invalid literal/length code");
              if (iVar1 == 0) {
                e = invalid_literal_length;
              }
              else {
                iVar1 = strcmp(__s1,"invalid distance code");
                if (iVar1 == 0) {
                  e = invalid_distance_code;
                }
                else {
                  iVar1 = strcmp(__s1,"invalid distance too far back");
                  if (iVar1 == 0) {
                    e = invalid_distance;
                  }
                  else {
                    iVar1 = strcmp(__s1,"invalid bit length repeat");
                    if (iVar1 == 0) {
                      e = invalid_bit_length_repeat;
                    }
                    else {
                      iVar1 = strcmp(__s1,"invalid code -- missing end-of-block");
                      if (iVar1 == 0) {
                        e = missing_eob;
                      }
                      else {
                        iVar1 = strcmp(__s1,"unknown compression method");
                        if (iVar1 == 0) {
                          e = unknown_compression_method;
                        }
                        else {
                          iVar1 = strcmp(__s1,"invalid window size");
                          if (iVar1 == 0) {
                            e = invalid_window_size;
                          }
                          else {
                            iVar1 = strcmp(__s1,"incorrect header check");
                            if (iVar1 == 0) {
                              e = incorrect_header_check;
                            }
                            else {
                              iVar1 = strcmp(__s1,"incorrect data check");
                              if (iVar1 == 0) {
                                e = incorrect_data_check;
                              }
                              else {
                                iVar1 = strcmp(__s1,"incorrect length check");
                                if (iVar1 == 0) {
                                  e = incorrect_length_check;
                                }
                                else {
                                  iVar1 = strcmp(__s1,"header crc mismatch");
                                  if (iVar1 == 0) {
                                    e = header_crc_mismatch;
                                  }
                                  else {
                                    iVar1 = strcmp(__s1,"unknown header flags set");
                                    if (iVar1 != 0) goto switchD_00109516_caseD_fffffffe;
                                    e = unknown_header_flags;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    break;
  case -2:
switchD_00109516_caseD_fffffffe:
    e = stream_error;
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"zlib decompressor: impossible value");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  system::error_code::error_code<boost::deflate::error>(&local_20,e,(type *)0x0);
LAB_001096d9:
  return CONCAT44(local_20._4_4_,local_20.val_);
}

Assistant:

error_code write(Flush flush) override {
            constexpr static int zlib_flushes[] = {0, Z_BLOCK, Z_PARTIAL_FLUSH, Z_SYNC_FLUSH, Z_FULL_FLUSH, Z_FINISH, Z_TREES};
            const auto zlib_flush = zlib_flushes[static_cast<int>(flush)];
            const auto res = ::inflate(&zs, zlib_flush);
            switch(res){
            case Z_OK:
              return {};
            case Z_STREAM_END:
              return error::end_of_stream;
            case Z_NEED_DICT:
              return error::need_dict;
            case Z_DATA_ERROR:
                if(zs.msg && !std::strcmp(zs.msg, "invalid stored block lengths"))
                    return error::invalid_stored_length;
                if(zs.msg && !std::strcmp(zs.msg, "invalid block type"))
                    return error::invalid_block_type;
                if(zs.msg && !std::strcmp(zs.msg, "too many length or distance symbols"))
                    return error::too_many_symbols;
                if(zs.msg && !std::strcmp(zs.msg, "invalid code lengths set"))
                    return error::incomplete_length_set;
                if(zs.msg && !std::strcmp(zs.msg, "invalid literal/lengths set"))
                    return error::over_subscribed_length;
                if(zs.msg && !std::strcmp(zs.msg, "invalid literal/length code"))
                    return error::invalid_literal_length;
                if(zs.msg && !std::strcmp(zs.msg, "invalid distance code"))
                    return error::invalid_distance_code;
                if(zs.msg && !std::strcmp(zs.msg, "invalid distance too far back"))
                    return error::invalid_distance;
                if(zs.msg && !std::strcmp(zs.msg, "invalid bit length repeat"))
                    return error::invalid_bit_length_repeat;
                if(zs.msg && !std::strcmp(zs.msg, "invalid code -- missing end-of-block"))
                    return error::missing_eob;
                if(zs.msg && !std::strcmp(zs.msg, "unknown compression method"))
                    return error::unknown_compression_method;
                if(zs.msg && !std::strcmp(zs.msg, "invalid window size"))
                        return error::invalid_window_size;
                if(zs.msg && !std::strcmp(zs.msg, "incorrect header check"))
                        return error::incorrect_header_check;
                if(zs.msg && !std::strcmp(zs.msg, "incorrect data check"))
                    return error::incorrect_data_check;
                if(zs.msg && !std::strcmp(zs.msg, "incorrect length check"))
                    return error::incorrect_length_check;
                if(zs.msg && !std::strcmp(zs.msg, "header crc mismatch"))
                    return error::header_crc_mismatch;
                if(zs.msg && !std::strcmp(zs.msg, "unknown header flags set"))
                    return error::unknown_header_flags;
                BOOST_FALLTHROUGH;
            case Z_STREAM_ERROR:
              return error::stream_error;
            case Z_MEM_ERROR:
              throw std::bad_alloc{};
            case Z_BUF_ERROR:
              return error::need_buffers;
            default:
              throw std::runtime_error{"zlib decompressor: impossible value"};
            }
        }